

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::AsyncInputStream::pumpTo(AsyncInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  uint64_t in_RCX;
  char local_38 [8];
  _func_int **local_30;
  
  pp_Var2 = (_func_int **)(**(code **)(*(long *)amount + 0x10))(local_38,amount,output);
  pp_Var1 = local_30;
  if (local_38[0] == '\x01') {
    local_30 = (_func_int **)0x0;
    pp_Var2 = pp_Var1;
  }
  if (local_38[0] == '\0') {
    unoptimizedPumpTo((kj *)this,(AsyncInputStream *)output,(AsyncOutputStream *)amount,in_RCX,0);
  }
  else {
    this->_vptr_AsyncInputStream = pp_Var2;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> AsyncInputStream::pumpTo(
    AsyncOutputStream& output, uint64_t amount) {
  // See if output wants to dispatch on us.
  KJ_IF_SOME(result, output.tryPumpFrom(*this, amount)) {
    return kj::mv(result);
  }

  // OK, fall back to naive approach.
  return unoptimizedPumpTo(*this, output, amount);
}